

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

CBComment * __thiscall asmjit::CodeBuilder::newCommentNode(CodeBuilder *this,char *s,size_t len)

{
  int iVar1;
  Error error;
  Error extraout_EAX;
  undefined4 extraout_var;
  CBComment *pCVar3;
  CBLabel *node;
  ushort uVar4;
  CodeBuilder *pCVar5;
  CodeBuilder *pCVar6;
  CBNode *pCVar7;
  size_t sStack_40;
  char *pcStack_38;
  size_t sStack_18;
  char *pcVar2;
  
  pCVar5 = (CodeBuilder *)s;
  pCVar6 = this;
  if (s == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    if (len == 0xffffffffffffffff) {
      pCVar6 = (CodeBuilder *)s;
      len = strlen(s);
    }
    pcVar2 = s;
    if (len != 0) {
      pCVar6 = (CodeBuilder *)&this->_cbDataZone;
      iVar1 = Zone::dup((Zone *)pCVar6,(int)s);
      pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
      pCVar5 = (CodeBuilder *)s;
      if (pcVar2 == (char *)0x0) {
        return (CBComment *)0x0;
      }
    }
  }
  if ((this->_cbHeap)._zone != (Zone *)0x0) {
    pCVar3 = (CBComment *)ZoneHeap::_alloc(&this->_cbHeap,0x28,&sStack_18);
    (pCVar3->super_CBNode)._prev = (CBNode *)0x0;
    (pCVar3->super_CBNode)._next = (CBNode *)0x0;
    (pCVar3->super_CBNode)._type = '\a';
    (pCVar3->super_CBNode)._opCount = '\0';
    uVar4 = (ushort)this->_nodeFlags;
    (pCVar3->super_CBNode)._flags = uVar4;
    (pCVar3->super_CBNode)._position = this->_position;
    (pCVar3->super_CBNode)._inlineComment = (char *)0x0;
    (pCVar3->super_CBNode)._passData = (void *)0x0;
    (pCVar3->super_CBNode)._flags = uVar4 | 0xc;
    (pCVar3->super_CBNode)._inlineComment = pcVar2;
    return pCVar3;
  }
  newCommentNode();
  pCVar7 = (CBNode *)0xffffffff00000004;
  if ((pCVar5->super_CodeEmitter)._lastError == 0) {
    pcStack_38 = pcVar2;
    if ((pCVar5->_cbHeap)._zone == (Zone *)0x0) {
      newLabel();
      error = extraout_EAX;
    }
    else {
      node = (CBLabel *)ZoneHeap::_alloc(&pCVar5->_cbHeap,0x38,&sStack_40);
      (node->super_CBNode)._prev = (CBNode *)0x0;
      (node->super_CBNode)._next = (CBNode *)0x0;
      (node->super_CBNode)._type = '\x04';
      (node->super_CBNode)._opCount = '\0';
      (node->super_CBNode)._flags = (uint16_t)pCVar5->_nodeFlags;
      (node->super_CBNode)._position = pCVar5->_position;
      (node->super_CBNode)._inlineComment = (char *)0x0;
      (node->super_CBNode)._passData = (void *)0x0;
      node->_id = 0xffffffff;
      node->_numRefs = 0;
      node->_from = (CBJump *)0x0;
      error = registerLabelNode(pCVar5,node);
      if (error == 0) {
        pCVar7 = (CBNode *)((ulong)node->_id << 0x20 | 4);
        goto LAB_001124f4;
      }
    }
    CodeEmitter::setLastError(&pCVar5->super_CodeEmitter,error,(char *)0x0);
  }
LAB_001124f4:
  (pCVar6->super_CodeEmitter)._vptr_CodeEmitter = (_func_int **)pCVar7;
  *(CBNode **)&(pCVar6->super_CodeEmitter)._codeInfo = (CBNode *)0x0;
  return (CBComment *)pCVar6;
}

Assistant:

CBComment* CodeBuilder::newCommentNode(const char* s, size_t len) noexcept {
  if (s) {
    if (len == Globals::kInvalidIndex) len = ::strlen(s);
    if (len > 0) {
      s = static_cast<char*>(_cbDataZone.dup(s, len, true));
      if (!s) return nullptr;
    }
  }

  return newNodeT<CBComment>(s);
}